

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O0

ON_PolynomialCurve * __thiscall
ON_PolynomialCurve::operator=(ON_PolynomialCurve *this,ON_BezierCurve *src)

{
  bool bVar1;
  int iVar2;
  ON_4dPoint *pOVar3;
  double *pdVar4;
  int local_74;
  ON_4dPoint *cv_1;
  ON_4dPoint *cv;
  undefined1 local_48 [8];
  ON_BezierCurve s;
  double d;
  int i;
  ON_BezierCurve *src_local;
  ON_PolynomialCurve *this_local;
  
  this->m_dim = src->m_dim;
  this->m_is_rat = src->m_is_rat;
  this->m_order = src->m_order;
  ON_SimpleArray<ON_4dPoint>::Reserve
            (&(this->m_cv).super_ON_SimpleArray<ON_4dPoint>,(long)src->m_order);
  ON_SimpleArray<ON_4dPoint>::SetCount(&(this->m_cv).super_ON_SimpleArray<ON_4dPoint>,src->m_order);
  ON_SimpleArray<ON_4dPoint>::Zero(&(this->m_cv).super_ON_SimpleArray<ON_4dPoint>);
  if ((1 < this->m_order) && (iVar2 = ON_BezierCurve::CVSize(src), iVar2 < 5)) {
    ON_BezierCurve::ON_BezierCurve((ON_BezierCurve *)local_48);
    if (src->m_is_rat == 0) {
      local_74 = src->m_dim;
    }
    else {
      local_74 = src->m_dim + 1;
    }
    local_48._0_4_ = local_74;
    local_48._4_4_ = 0;
    s.m_dim = src->m_order;
    s._8_8_ = src->m_cv;
    iVar2 = this->m_order;
    pOVar3 = ON_SimpleArray<ON_4dPoint>::operator[]
                       (&(this->m_cv).super_ON_SimpleArray<ON_4dPoint>,0);
    bVar1 = ON_BezierCurve::Evaluate((ON_BezierCurve *)local_48,0.0,iVar2 + -1,4,&pOVar3->x);
    if (bVar1) {
      if (this->m_is_rat == 0) {
        pOVar3 = ON_SimpleArray<ON_4dPoint>::operator[]
                           (&(this->m_cv).super_ON_SimpleArray<ON_4dPoint>,0);
        pOVar3->w = 1.0;
      }
      else if (this->m_dim < 3) {
        for (d._4_4_ = 0; d._4_4_ < this->m_order; d._4_4_ = d._4_4_ + 1) {
          pOVar3 = ON_SimpleArray<ON_4dPoint>::operator[]
                             (&(this->m_cv).super_ON_SimpleArray<ON_4dPoint>,d._4_4_);
          pdVar4 = ON_4dPoint::operator[](pOVar3,this->m_dim);
          pOVar3->w = *pdVar4;
          pdVar4 = ON_4dPoint::operator[](pOVar3,this->m_dim);
          *pdVar4 = 0.0;
        }
      }
      for (d._4_4_ = 2; d._4_4_ < this->m_order; d._4_4_ = d._4_4_ + 1) {
        s._24_8_ = 1.0 / (double)d._4_4_;
        pOVar3 = ON_SimpleArray<ON_4dPoint>::operator[]
                           (&(this->m_cv).super_ON_SimpleArray<ON_4dPoint>,d._4_4_);
        pOVar3->x = (double)s._24_8_ * pOVar3->x;
        pOVar3->y = (double)s._24_8_ * pOVar3->y;
        pOVar3->z = (double)s._24_8_ * pOVar3->z;
        pOVar3->w = (double)s._24_8_ * pOVar3->w;
      }
    }
    else {
      ON_SimpleArray<ON_4dPoint>::Zero(&(this->m_cv).super_ON_SimpleArray<ON_4dPoint>);
      pOVar3 = ON_SimpleArray<ON_4dPoint>::operator[]
                         (&(this->m_cv).super_ON_SimpleArray<ON_4dPoint>,0);
      pOVar3->w = 1.0;
    }
    s.m_order = 0;
    s.m_cv_stride = 0;
    ON_BezierCurve::~ON_BezierCurve((ON_BezierCurve *)local_48);
  }
  return this;
}

Assistant:

ON_PolynomialCurve& ON_PolynomialCurve::operator=(const ON_BezierCurve& src)
{
  int i;
  double d;
  m_dim = src.m_dim;
  m_is_rat = src.m_is_rat;
  m_order = src.m_order;
  m_cv.Reserve( src.m_order );
  m_cv.SetCount( src.m_order );
  m_cv.Zero();
  //m_domain = src.m_domain;

  if ( m_order >= 2 && src.CVSize() <= 4 ) {
    ON_BezierCurve s; // scratch surface for homogeneous evaluation
    s.m_dim = src.m_is_rat ? src.m_dim+1 : src.m_dim;
    s.m_is_rat = 0;
    s.m_order = src.m_order;
    s.m_cv = src.m_cv;
    //s.m_domain.m_t[0] = 0.0;
    //s.m_domain.m_t[1] = 1.0;
    if ( s.Evaluate( 0.0, m_order-1, 4, &m_cv[0].x ) ) {
      if ( m_is_rat ) {
        if ( m_dim < 3 ) {
          for ( i = 0; i < m_order; i++ ) {
            ON_4dPoint& cv = m_cv[i];
            cv.w = cv[m_dim];
            cv[m_dim] = 0.0;
          }
        }
      }
      else {
        m_cv[0].w = 1.0;
      }
      for ( i = 2; i < m_order; i++ ) {
        d = 1.0/i;
        ON_4dPoint& cv = m_cv[i];
        cv.x *= d;
        cv.y *= d;
        cv.z *= d;
        cv.w *= d;
      }
    }
    else {
      m_cv.Zero();
      m_cv[0].w = 1.0;
    }
    s.m_cv = 0;
  }

  return *this;
}